

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::endsWith(string *s,string *suffix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong in_RDI;
  undefined6 in_stack_ffffffffffffffc0;
  byte bVar2;
  string local_38 [40];
  ulong local_10;
  byte local_1;
  
  local_10 = in_RDI;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::size();
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::size();
  bVar2 = 0;
  local_1 = false;
  if (pbVar1 <= __rhs) {
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_38,local_10);
    bVar2 = 1;
    local_1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(1,CONCAT16(local_1,in_stack_ffffffffffffffc0)),__rhs);
  }
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool endsWith( std::string const& s, std::string const& suffix ) {
        return s.size() >= suffix.size() && s.substr( s.size()-suffix.size(), suffix.size() ) == suffix;
    }